

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

void __thiscall IDLExport::adaptNamespace(IDLExport *this,ostream *stream,string *ns)

{
  size_t __n;
  _List_node_base *__n_00;
  _List_node_base *__position;
  int iVar1;
  ostream *poVar2;
  string *name;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_namespace;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_namespace;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string *local_78;
  string *local_70;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  name = (string *)&this->m_namespace;
  __n = (this->m_namespace)._M_string_length;
  if (__n == ns->_M_string_length) {
    if (__n == 0) goto LAB_0010d561;
    iVar1 = bcmp((((string *)name)->_M_dataplus)._M_p,(ns->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) goto LAB_0010d561;
  }
  local_70 = name;
  anon_unknown.dwarf_19656::nameSplit
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,(string *)name);
  anon_unknown.dwarf_19656::nameSplit
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_90,ns);
  while (((__position = local_68._M_impl._M_node.super__List_node_base._M_next,
          local_68._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_68 &&
          (local_90._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_90))
         && (__n_00 = local_68._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,
            __n_00 == local_90._M_impl._M_node.super__List_node_base._M_next[1]._M_prev))) {
    if (__n_00 != (_List_node_base *)0x0) {
      iVar1 = bcmp(local_68._M_impl._M_node.super__List_node_base._M_next[1]._M_next,
                   local_90._M_impl._M_node.super__List_node_base._M_next[1]._M_next,(size_t)__n_00)
      ;
      if (iVar1 != 0) break;
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68,(iterator)__position);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_90,(iterator)local_90._M_impl._M_node.super__List_node_base._M_next);
  }
  local_78 = ns;
  closeNamespaces(this,stream,(int)local_68._M_impl._M_node._M_size);
  if (local_90._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_90) {
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"module ",7);
      anon_unknown.dwarf_19656::normalizeIDLName
                (&local_50,
                 (anon_unknown_dwarf_19656 *)
                 local_90._M_impl._M_node.super__List_node_base._M_next[1]._M_next,
                 (string *)local_90._M_impl._M_node.super__List_node_base._M_next[1]._M_prev);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," {\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)&this->m_indent);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_90,(iterator)local_90._M_impl._M_node.super__List_node_base._M_next);
    } while (local_90._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_90)
    ;
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_90);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_68);
  name = local_70;
LAB_0010d561:
  std::__cxx11::string::_M_assign(name);
  return;
}

Assistant:

void IDLExport::adaptNamespace(ostream& stream, string const& ns)
{
    if (m_namespace != ns)
    {
        list<string>
            old_namespace = nameSplit(m_namespace),
            new_namespace = nameSplit(ns);

        while(!old_namespace.empty() && !new_namespace.empty() && old_namespace.front() == new_namespace.front())
        {
            old_namespace.pop_front();
            new_namespace.pop_front();
        }

        closeNamespaces(stream, old_namespace.size());

        while (!new_namespace.empty())
        {
            stream << m_indent << "module " << normalizeIDLName(new_namespace.front()) << " {\n";
            m_indent += "    ";
            new_namespace.pop_front();
        }
    }
    m_namespace = ns;
}